

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

ExtPubkey *
cfd::core::ConfidentialTransaction::GenerateExtPubkeyFromDescriptor
          (ExtPubkey *__return_storage_ptr__,string *bitcoin_descriptor,uint32_t bip32_counter,
          ByteData *prefix,NetType net_type,NetType elements_net_type,ExtPubkey *base_ext_pubkey,
          Address *descriptor_derive_address)

{
  bool bVar1;
  bool bVar2;
  __type _Var3;
  AddressType AVar4;
  CfdException *pCVar5;
  string xpub_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f08;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arg_list;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arg_list_base;
  string desc_str;
  DescriptorScriptReference local_e88;
  DescriptorScriptReference derive_script;
  DescriptorScriptReference script_ref;
  ExtPubkey xpub;
  Descriptor desc;
  DescriptorKeyReference key_ref;
  
  if (elements_net_type == kLiquidV1) {
    bVar2 = true;
  }
  else {
    if (elements_net_type < kLiquidV1) {
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&script_ref,"Illegal elements network type error.",
                 (allocator *)&derive_script);
      CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&script_ref);
      __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
    }
    bVar2 = false;
  }
  ExtPubkey::ExtPubkey(__return_storage_ptr__);
  ExtPubkey::ExtPubkey(&xpub);
  ::std::__cxx11::string::string((string *)&desc_str,(string *)bitcoin_descriptor);
  ExtPubkey::ExtPubkey((ExtPubkey *)&script_ref,bitcoin_descriptor);
  ExtPubkey::GetVersionData((ByteData *)&derive_script,(ExtPubkey *)&script_ref);
  bVar1 = ByteData::Equals((ByteData *)&derive_script,prefix);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&derive_script);
  if (bVar1) {
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e88
                     ,"pkh(",bitcoin_descriptor);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &derive_script,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e88
                     ,")");
    ::std::__cxx11::string::operator=((string *)&desc_str,(string *)&derive_script);
    ::std::__cxx11::string::~string((string *)&derive_script);
    ::std::__cxx11::string::~string((string *)&local_e88);
  }
  ExtPubkey::~ExtPubkey((ExtPubkey *)&script_ref);
  arg_list_base.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  arg_list_base.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  arg_list_base.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::__cxx11::string::string((string *)&script_ref,"base",(allocator *)&derive_script);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&arg_list_base,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&script_ref);
  ::std::__cxx11::string::~string((string *)&script_ref);
  arg_list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  arg_list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  arg_list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::__cxx11::to_string((string *)&script_ref,bip32_counter);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&arg_list,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&script_ref);
  ::std::__cxx11::string::~string((string *)&script_ref);
  Descriptor::Parse(&desc,&desc_str,
                    (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                     *)0x0);
  Descriptor::GetReference(&script_ref,&desc,&arg_list_base);
  AVar4 = DescriptorScriptReference::GetAddressType(&script_ref);
  if (AVar4 != kP2pkhAddress) {
    if ((AVar4 != kP2wpkhAddress) && (AVar4 != kP2shP2wpkhAddress)) {
      derive_script._0_8_ =
           (long)
           "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_elements_transaction.cpp"
           + 99;
      derive_script.locking_script_._vptr_Script._0_4_ = 0xcec;
      derive_script.locking_script_.script_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = "GenerateExtPubkeyFromDescriptor";
      logger::warn<>((CfdSourceLocation *)&derive_script,"bitcoin_descriptor invalid type.");
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&derive_script,
                 "bitcoin_descriptor is not of any type supported: pkh(<xpub>), sh(wpkh(<xpub>)), wpkh(<xpub>), or <xpub>."
                 ,(allocator *)&local_e88);
      CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&derive_script);
      __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if (bVar2) {
      derive_script._0_8_ =
           (long)
           "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_elements_transaction.cpp"
           + 99;
      derive_script.locking_script_._vptr_Script._0_4_ = 0xce4;
      derive_script.locking_script_.script_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = "GenerateExtPubkeyFromDescriptor";
      AVar4 = DescriptorScriptReference::GetAddressType(&script_ref);
      local_e88.script_type_ = AVar4;
      logger::warn<cfd::core::AddressType>
                ((CfdSourceLocation *)&derive_script,"liquidv1 not supported address type[{}].",
                 &local_e88.script_type_);
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&derive_script,
                 "bitcoin_descriptor is not of any type supported: pkh(<xpub>)",
                 (allocator *)&local_e88);
      CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&derive_script);
      __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  AVar4 = DescriptorScriptReference::GetAddressType(&script_ref);
  if (AVar4 == kP2shP2wpkhAddress) {
    DescriptorScriptReference::GetChild(&derive_script,&script_ref);
    DescriptorScriptReference::operator=(&script_ref,&derive_script);
    DescriptorScriptReference::~DescriptorScriptReference(&derive_script);
  }
  DescriptorScriptReference::GetKeyList
            ((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              *)&derive_script,&script_ref);
  DescriptorKeyReference::DescriptorKeyReference
            (&key_ref,(DescriptorKeyReference *)derive_script._0_8_);
  ::std::
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
  ~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
           *)&derive_script);
  bVar2 = DescriptorKeyReference::HasExtPubkey(&key_ref);
  if (bVar2) {
    DescriptorKeyReference::GetExtPubkey((ExtPubkey *)&derive_script,&key_ref);
    ExtPubkey::operator=(base_ext_pubkey,(ExtPubkey *)&derive_script);
    ExtPubkey::~ExtPubkey((ExtPubkey *)&derive_script);
    ExtPubkey::GetVersionData((ByteData *)&derive_script,base_ext_pubkey);
    bVar2 = ByteData::Equals((ByteData *)&derive_script,prefix);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&derive_script);
    if (bVar2) {
      DescriptorScriptReference::DescriptorScriptReference(&derive_script);
      Descriptor::GetReference(&local_e88,&desc,&arg_list);
      DescriptorScriptReference::operator=(&derive_script,&local_e88);
      DescriptorScriptReference::~DescriptorScriptReference(&local_e88);
      DescriptorScriptReference::operator=(&script_ref,&derive_script);
      AVar4 = DescriptorScriptReference::GetAddressType(&script_ref);
      if (AVar4 == kP2shP2wpkhAddress) {
        DescriptorScriptReference::GetChild(&local_e88,&script_ref);
        DescriptorScriptReference::operator=(&script_ref,&local_e88);
        DescriptorScriptReference::~DescriptorScriptReference(&local_e88);
      }
      DescriptorScriptReference::GetKeyList
                ((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                  *)&local_e88,&script_ref);
      DescriptorKeyReference::operator=(&key_ref,(DescriptorKeyReference *)local_e88._0_8_);
      ::std::
      vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
      ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                 *)&local_e88);
      DescriptorKeyReference::GetExtPubkey((ExtPubkey *)&local_e88,&key_ref);
      ExtPubkey::operator=(__return_storage_ptr__,(ExtPubkey *)&local_e88);
      ExtPubkey::~ExtPubkey((ExtPubkey *)&local_e88);
      ExtPubkey::ToString_abi_cxx11_((string *)&local_e88,__return_storage_ptr__);
      ExtPubkey::ToString_abi_cxx11_(&xpub_str,base_ext_pubkey);
      _Var3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&local_e88,&xpub_str);
      ::std::__cxx11::string::~string((string *)&xpub_str);
      ::std::__cxx11::string::~string((string *)&local_e88);
      if (_Var3) {
        ExtPubkey::ToString_abi_cxx11_((string *)&local_e88,base_ext_pubkey);
        ::std::operator+(&xpub_str,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_e88,"/0/*");
        ::std::__cxx11::string::~string((string *)&local_e88);
        AVar4 = DescriptorScriptReference::GetAddressType(&derive_script);
        if (AVar4 == kP2shP2wpkhAddress) {
          ::std::operator+(&local_f08,"sh(wpkh(",&xpub_str);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_e88,&local_f08,"))");
        }
        else {
          AVar4 = DescriptorScriptReference::GetAddressType(&derive_script);
          if (AVar4 == kP2wpkhAddress) {
            ::std::operator+(&local_f08,"wpkh(",&xpub_str);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_e88,&local_f08,")");
          }
          else {
            ::std::operator+(&local_f08,"pkh(",&xpub_str);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_e88,&local_f08,")");
          }
        }
        ::std::__cxx11::string::operator=((string *)&xpub_str,(string *)&local_e88);
        ::std::__cxx11::string::~string((string *)&local_e88);
        ::std::__cxx11::string::~string((string *)&local_f08);
        Descriptor::Parse((Descriptor *)&local_e88,&xpub_str,
                          (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                           *)0x0);
        Descriptor::operator=(&desc,(Descriptor *)&local_e88);
        DescriptorNode::~DescriptorNode((DescriptorNode *)&local_e88);
        Descriptor::GetReference(&local_e88,&desc,&arg_list);
        DescriptorScriptReference::operator=(&derive_script,&local_e88);
        DescriptorScriptReference::~DescriptorScriptReference(&local_e88);
        DescriptorScriptReference::operator=(&script_ref,&derive_script);
        AVar4 = DescriptorScriptReference::GetAddressType(&script_ref);
        if (AVar4 == kP2shP2wpkhAddress) {
          DescriptorScriptReference::GetChild(&local_e88,&script_ref);
          DescriptorScriptReference::operator=(&script_ref,&local_e88);
          DescriptorScriptReference::~DescriptorScriptReference(&local_e88);
        }
        DescriptorScriptReference::GetKeyList
                  ((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                    *)&local_e88,&script_ref);
        DescriptorKeyReference::operator=(&key_ref,(DescriptorKeyReference *)local_e88._0_8_);
        ::std::
        vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
        ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                   *)&local_e88);
        DescriptorKeyReference::GetExtPubkey((ExtPubkey *)&local_e88,&key_ref);
        ExtPubkey::operator=(__return_storage_ptr__,(ExtPubkey *)&local_e88);
        ExtPubkey::~ExtPubkey((ExtPubkey *)&local_e88);
        ::std::__cxx11::string::~string((string *)&xpub_str);
      }
      if (descriptor_derive_address != (Address *)0x0) {
        DescriptorScriptReference::GenerateAddress((Address *)&local_e88,&derive_script,net_type);
        core::Address::operator=(descriptor_derive_address,(Address *)&local_e88);
        core::Address::~Address((Address *)&local_e88);
      }
      DescriptorScriptReference::~DescriptorScriptReference(&derive_script);
      DescriptorKeyReference::~DescriptorKeyReference(&key_ref);
      DescriptorScriptReference::~DescriptorScriptReference(&script_ref);
      DescriptorNode::~DescriptorNode(&desc.root_node_);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&arg_list);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&arg_list_base);
      ::std::__cxx11::string::~string((string *)&desc_str);
      ExtPubkey::~ExtPubkey(&xpub);
      return __return_storage_ptr__;
    }
    local_e88._0_8_ = "cfdcore_elements_transaction.cpp";
    local_e88.locking_script_._vptr_Script._0_4_ = 0xcff;
    local_e88.locking_script_.script_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "GenerateExtPubkeyFromDescriptor";
    ExtPubkey::GetVersionData((ByteData *)&xpub_str,&xpub);
    ByteData::GetHex_abi_cxx11_((string *)&derive_script,(ByteData *)&xpub_str);
    logger::warn<std::__cxx11::string>
              ((CfdSourceLocation *)&local_e88,"bitcoin_descriptor illegal prefix[{}].",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&derive_script);
    ::std::__cxx11::string::~string((string *)&derive_script);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&xpub_str);
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&derive_script,"bitcoin_descriptor illegal prefix.",(allocator *)&local_e88
              );
    CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&derive_script);
    __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
  }
  derive_script._0_8_ =
       (long)
       "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_elements_transaction.cpp"
       + 99;
  derive_script.locking_script_._vptr_Script._0_4_ = 0xcf8;
  derive_script.locking_script_.script_data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = "GenerateExtPubkeyFromDescriptor";
  logger::warn<>((CfdSourceLocation *)&derive_script,"bitcoin_descriptor invalid extkey format.");
  pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&derive_script,"BitcoinDescriptor invalid extkey format.",
             (allocator *)&local_e88);
  CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&derive_script);
  __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ExtPubkey ConfidentialTransaction::GenerateExtPubkeyFromDescriptor(
    const std::string &bitcoin_descriptor, uint32_t bip32_counter,
    const ByteData &prefix, NetType net_type, NetType elements_net_type,
    ExtPubkey *base_ext_pubkey, Address *descriptor_derive_address) {
  bool is_liquidv1 = false;
  switch (elements_net_type) {
    case NetType::kMainnet:
    case NetType::kTestnet:
    case NetType::kRegtest:
      throw CfdException(
          kCfdIllegalArgumentError, "Illegal elements network type error.");
    case NetType::kLiquidV1:
      is_liquidv1 = true;
      break;
    case NetType::kElementsRegtest:
    case NetType::kCustomChain:
    default:
      break;
  }

  ExtPubkey child_xpub;
  ExtPubkey xpub;
  std::string desc_str = bitcoin_descriptor;
  try {
    // check extkey (not output descriptor)
    ExtPubkey check_key(bitcoin_descriptor);
    if (check_key.GetVersionData().Equals(prefix)) {
      desc_str = "pkh(" + bitcoin_descriptor + ")";  // create pkh descriptor
    }
  } catch (const CfdException &except) {
    info(
        CFD_LOG_SOURCE, "bitcoin_descriptor check fail. go on next check.({})",
        except.what());
    // other descriptor
  }

  std::vector<std::string> arg_list_base;
  arg_list_base.push_back(std::string(kArgumentBaseExtkey));
  std::vector<std::string> arg_list;
  arg_list.push_back(std::to_string(bip32_counter));
  Descriptor desc = Descriptor::Parse(desc_str);
  DescriptorScriptReference script_ref = desc.GetReference(&arg_list_base);
  switch (script_ref.GetAddressType()) {
    case AddressType::kP2pkhAddress:
      break;
    case AddressType::kP2wpkhAddress:
    case AddressType::kP2shP2wpkhAddress:
      if (is_liquidv1) {
        warn(
            CFD_LOG_SOURCE, "liquidv1 not supported address type[{}].",
            script_ref.GetAddressType());
        throw CfdException(
            kCfdIllegalArgumentError,
            "bitcoin_descriptor is not of any type supported: pkh(<xpub>)");
      }
      break;
    default:
      warn(CFD_LOG_SOURCE, "bitcoin_descriptor invalid type.");
      throw CfdException(
          kCfdIllegalArgumentError,
          "bitcoin_descriptor is not of any type supported: pkh(<xpub>), "
          "sh(wpkh(<xpub>)), wpkh(<xpub>), or <xpub>.");
  }

  if (script_ref.GetAddressType() == AddressType::kP2shP2wpkhAddress) {
    script_ref = script_ref.GetChild();
  }
  DescriptorKeyReference key_ref = script_ref.GetKeyList()[0];
  if (!key_ref.HasExtPubkey()) {
    warn(CFD_LOG_SOURCE, "bitcoin_descriptor invalid extkey format.");
    throw CfdException(
        kCfdIllegalArgumentError, "BitcoinDescriptor invalid extkey format.");
  }
  *base_ext_pubkey = key_ref.GetExtPubkey();
  if (!base_ext_pubkey->GetVersionData().Equals(prefix)) {
    warn(
        CFD_LOG_SOURCE, "bitcoin_descriptor illegal prefix[{}].",
        xpub.GetVersionData().GetHex());
    throw CfdException(
        kCfdIllegalArgumentError, "bitcoin_descriptor illegal prefix.");
  }

  // collect derive key
  DescriptorScriptReference derive_script;
  derive_script = desc.GetReference(&arg_list);
  script_ref = derive_script;
  if (script_ref.GetAddressType() == AddressType::kP2shP2wpkhAddress) {
    script_ref = script_ref.GetChild();
  }
  key_ref = script_ref.GetKeyList()[0];
  child_xpub = key_ref.GetExtPubkey();

  // If it is the same as base, add a default path.
  if (child_xpub.ToString() == base_ext_pubkey->ToString()) {
    std::string xpub_str = base_ext_pubkey->ToString() + "/0/*";
    if (derive_script.GetAddressType() == AddressType::kP2shP2wpkhAddress) {
      xpub_str = "sh(wpkh(" + xpub_str + "))";
    } else if (derive_script.GetAddressType() == AddressType::kP2wpkhAddress) {
      xpub_str = "wpkh(" + xpub_str + ")";
    } else {
      xpub_str = "pkh(" + xpub_str + ")";
    }
    desc = Descriptor::Parse(xpub_str);
    derive_script = desc.GetReference(&arg_list);
    script_ref = derive_script;
    if (script_ref.GetAddressType() == AddressType::kP2shP2wpkhAddress) {
      script_ref = script_ref.GetChild();
    }
    key_ref = script_ref.GetKeyList()[0];
    child_xpub = key_ref.GetExtPubkey();
  }

  if (descriptor_derive_address != nullptr) {
    *descriptor_derive_address = derive_script.GenerateAddress(net_type);
  }
  return child_xpub;
}